

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::(anonymous_namespace)::TestCase4992::run()::$_0::operator()(kj::HttpServer::SuspendableRequest&)
::Response__(void *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
            AsyncInputStream *requestBody,Response *response)

{
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  PromiseArena *pPVar5;
  TransformPromiseNodeBase *this_00;
  PromiseArena *in_stack_00000010;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  undefined1 local_48 [24];
  
  pp_Var1 = *(_func_int ***)(CONCAT44(in_register_00000034,method) + 0x40);
  pPVar5 = (PromiseArena *)(CONCAT44(in_register_00000034,method) + 8);
  yield();
  OVar3.ptr = local_58.ptr;
  pPVar2 = ((local_58.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar2) < 0x40) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5018:26)>
               ::anon_class_32_4_7c174187_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3c0) = &PTR_destroy_006157d8;
    *(_func_int ***)((long)pvVar4 + 0x3e0) = pp_Var1;
    *(PromiseArena **)((long)pvVar4 + 1000) = pPVar5;
    *(Response **)((long)pvVar4 + 0x3f0) = response;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = in_stack_00000010;
    *(void **)((long)pvVar4 + 0x3c8) = pvVar4;
  }
  else {
    ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_58.ptr + -4);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5018:26)>
               ::anon_class_32_4_7c174187_for_func::operator());
    OVar3.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006157d8;
    OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var1;
    OVar3.ptr[-2].super_PromiseArenaMember.arena = pPVar5;
    OVar3.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)response;
    OVar3.ptr[-1].super_PromiseArenaMember.arena = in_stack_00000010;
    OVar3.ptr[-4].super_PromiseArenaMember.arena = pPVar2;
  }
  local_48._0_8_ = &DAT_0048a171;
  local_48._8_8_ = &DAT_0048a1d0;
  local_48._16_8_ = &DAT_4c0000058b;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,&local_50,(SourceLocation *)local_48);
  OVar3.ptr = local_50.ptr;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_58.ptr;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
          HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
          kj::AsyncInputStream& requestBody, Response& response) override {
        return evalLater([&serviceCount = serviceCount, &table = table, &requestBody, &response]() {
          // This KJ_EXPECT here is the entire point of this test.
          KJ_EXPECT(serviceCount == 1)
          HttpHeaders responseHeaders(table);
          response.send(200, "OK", responseHeaders);
          return requestBody.readAllBytes().ignoreResult();
        });
      }